

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_triangle_fan(rf_vec2 *points,int points_count,rf_color color)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  int iVar16;
  rf_render_batch *prVar17;
  long lVar18;
  rf_vertex_buffer *prVar19;
  rf_context *prVar20;
  uint id;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  if (2 < points_count) {
    prVar17 = (rf__ctx->field_0).current_batch;
    lVar18 = prVar17->current_buffer;
    prVar19 = prVar17->vertex_buffers;
    if (prVar19[lVar18].elements_count * 4 <= prVar19[lVar18].v_counter + points_count * 4 + -8) {
      rf_gfx_draw();
    }
    prVar20 = rf__ctx;
    id = (rf__ctx->field_0).tex_shapes.id;
    if (id == 0) {
      id = (rf__ctx->field_0).default_texture_id;
      (rf__ctx->field_0).tex_shapes.id = id;
      (prVar20->field_0).tex_shapes.width = 1;
      (prVar20->field_0).tex_shapes.height = 1;
      (prVar20->field_0).tex_shapes.mipmaps = 1;
      (prVar20->field_0).tex_shapes.format = RF_UNCOMPRESSED_R8G8B8A8;
      *(undefined4 *)&(prVar20->field_0).tex_shapes.valid = 0;
      (prVar20->field_0).rec_tex_shapes.x = 0.0;
      (prVar20->field_0).rec_tex_shapes.y = 0.0;
      (prVar20->field_0).rec_tex_shapes.width = 1.0;
      (prVar20->field_0).rec_tex_shapes.height = 1.0;
    }
    rf_gfx_enable_texture(id);
    rf_gfx_begin(RF_QUADS);
    rf_gfx_color4ub(color.r,color.g,color.b,color.a);
    uVar21 = 1;
    do {
      prVar17 = (rf__ctx->field_0).current_batch;
      lVar18 = prVar17->current_buffer;
      prVar19 = prVar17->vertex_buffers;
      iVar16 = prVar19[lVar18].tc_counter;
      uVar2 = (rf__ctx->field_0).rec_tex_shapes.x;
      uVar9 = (rf__ctx->field_0).rec_tex_shapes.y;
      auVar22._4_4_ = uVar9;
      auVar22._0_4_ = uVar2;
      auVar22._8_8_ = 0;
      uVar3 = (rf__ctx->field_0).tex_shapes.width;
      uVar10 = (rf__ctx->field_0).tex_shapes.height;
      auVar25._0_4_ = (float)(int)uVar3;
      auVar25._4_4_ = (float)(int)uVar10;
      auVar25._8_8_ = 0;
      auVar22 = divps(auVar22,auVar25);
      *(long *)(prVar19[lVar18].texcoords + (long)iVar16 * 2) = auVar22._0_8_;
      prVar19[lVar18].tc_counter = iVar16 + 1;
      rf_gfx_vertex3f(points->x,points->y,prVar17->current_depth);
      prVar17 = (rf__ctx->field_0).current_batch;
      lVar18 = prVar17->current_buffer;
      prVar19 = prVar17->vertex_buffers;
      iVar16 = prVar19[lVar18].tc_counter;
      uVar4 = (rf__ctx->field_0).tex_shapes.width;
      uVar11 = (rf__ctx->field_0).tex_shapes.height;
      auVar26._0_4_ = (float)(int)uVar4;
      auVar26._4_4_ = (float)(int)uVar11;
      auVar26._8_8_ = 0;
      auVar29._4_4_ = (rf__ctx->field_0).rec_tex_shapes.y + (rf__ctx->field_0).rec_tex_shapes.height
      ;
      auVar29._0_4_ = (rf__ctx->field_0).rec_tex_shapes.x;
      auVar29._8_8_ = 0;
      auVar22 = divps(auVar29,auVar26);
      *(long *)(prVar19[lVar18].texcoords + (long)iVar16 * 2) = auVar22._0_8_;
      prVar19[lVar18].tc_counter = iVar16 + 1;
      rf_gfx_vertex3f(points[uVar21].x,points[uVar21].y,prVar17->current_depth);
      prVar17 = (rf__ctx->field_0).current_batch;
      lVar18 = prVar17->current_buffer;
      prVar19 = prVar17->vertex_buffers;
      iVar16 = prVar19[lVar18].tc_counter;
      uVar5 = (rf__ctx->field_0).rec_tex_shapes.x;
      uVar12 = (rf__ctx->field_0).rec_tex_shapes.y;
      uVar6 = (rf__ctx->field_0).rec_tex_shapes.width;
      uVar13 = (rf__ctx->field_0).rec_tex_shapes.height;
      auVar27._0_4_ = (float)uVar6 + (float)uVar5;
      auVar27._4_4_ = (float)uVar13 + (float)uVar12;
      auVar27._8_8_ = 0;
      uVar7 = (rf__ctx->field_0).tex_shapes.width;
      uVar14 = (rf__ctx->field_0).tex_shapes.height;
      auVar23._0_4_ = (float)(int)uVar7;
      auVar23._4_4_ = (float)(int)uVar14;
      auVar23._8_8_ = 0;
      auVar22 = divps(auVar27,auVar23);
      *(long *)(prVar19[lVar18].texcoords + (long)iVar16 * 2) = auVar22._0_8_;
      prVar19[lVar18].tc_counter = iVar16 + 1;
      uVar1 = uVar21 + 1;
      rf_gfx_vertex3f(points[uVar21 + 1].x,points[uVar21 + 1].y,prVar17->current_depth);
      auVar24._0_4_ = (rf__ctx->field_0).rec_tex_shapes.x + (rf__ctx->field_0).rec_tex_shapes.width;
      prVar17 = (rf__ctx->field_0).current_batch;
      lVar18 = prVar17->current_buffer;
      prVar19 = prVar17->vertex_buffers;
      iVar16 = prVar19[lVar18].tc_counter;
      uVar8 = (rf__ctx->field_0).tex_shapes.width;
      uVar15 = (rf__ctx->field_0).tex_shapes.height;
      auVar28._0_4_ = (float)(int)uVar8;
      auVar28._4_4_ = (float)(int)uVar15;
      auVar28._8_8_ = 0;
      auVar24._4_4_ = (rf__ctx->field_0).rec_tex_shapes.y;
      auVar24._8_8_ = 0;
      auVar22 = divps(auVar24,auVar28);
      *(long *)(prVar19[lVar18].texcoords + (long)iVar16 * 2) = auVar22._0_8_;
      prVar19[lVar18].tc_counter = iVar16 + 1;
      rf_gfx_vertex3f(points[uVar21 + 1].x,points[uVar21 + 1].y,prVar17->current_depth);
      uVar21 = uVar1;
    } while (points_count - 1 != uVar1);
    rf_gfx_end();
    rf_gfx_disable_texture();
    return;
  }
  return;
}

Assistant:

RF_API void rf_draw_triangle_fan(rf_vec2 *points, int points_count, rf_color color)
{
    if (points_count >= 3)
    {
        if (rf_gfx_check_buffer_limit((points_count - 2) * 4)) rf_gfx_draw();

        rf_gfx_enable_texture(rf_get_shapes_texture().id);
        rf_gfx_begin(RF_QUADS);
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        for (rf_int i = 1; i < points_count - 1; i++)
        {
            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[0].x, points[0].y);

            rf_gfx_tex_coord2f(rf_ctx.rec_tex_shapes.x / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i].x, points[i].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, (rf_ctx.rec_tex_shapes.y + rf_ctx.rec_tex_shapes.height) / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);

            rf_gfx_tex_coord2f((rf_ctx.rec_tex_shapes.x + rf_ctx.rec_tex_shapes.width) / rf_ctx.tex_shapes.width, rf_ctx.rec_tex_shapes.y / rf_ctx.tex_shapes.height);
            rf_gfx_vertex2f(points[i + 1].x, points[i + 1].y);
        }
        rf_gfx_end();
        rf_gfx_disable_texture();
    }
}